

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharMap.h
# Opt level: O0

unsigned_long __thiscall
UnifiedRegex::CharMap<char16_t,_unsigned_long,_(UnifiedRegex::CharMapScheme)1>::Get
          (CharMap<char16_t,_unsigned_long,_(UnifiedRegex::CharMapScheme)1> *this,Char kc)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  BOOL BVar4;
  CharMap<char16_t,_unsigned_long,_(UnifiedRegex::CharMapScheme)1> *local_28;
  unsigned_long lastOcc;
  CharMap<char16_t,_unsigned_long,_(UnifiedRegex::CharMapScheme)1> *pCStack_18;
  Char kc_local;
  CharMap<char16_t,_unsigned_long,_(UnifiedRegex::CharMapScheme)1> *this_local;
  
  lastOcc._6_2_ = kc;
  pCStack_18 = this;
  uVar2 = Chars<char16_t>::CTU(kc);
  uVar3 = GetDirectMapSize(this);
  if (uVar2 < uVar3) {
    uVar2 = Chars<char16_t>::CTU(lastOcc._6_2_);
    BVar4 = IsInDirectMap(this,uVar2);
    if (BVar4 == 0) {
      this_local = (CharMap<char16_t,_unsigned_long,_(UnifiedRegex::CharMapScheme)1> *)this->defv;
    }
    else {
      uVar2 = Chars<char16_t>::CTU(lastOcc._6_2_);
      this_local = (CharMap<char16_t,_unsigned_long,_(UnifiedRegex::CharMapScheme)1> *)
                   GetDirectMap(this,uVar2);
    }
  }
  else {
    uVar2 = Chars<char16_t>::CTU(lastOcc._6_2_);
    bVar1 = GetNonDirect(this,uVar2,(unsigned_long *)&local_28);
    if (bVar1) {
      this_local = local_28;
    }
    else {
      this_local = (CharMap<char16_t,_unsigned_long,_(UnifiedRegex::CharMapScheme)1> *)this->defv;
    }
  }
  return (unsigned_long)this_local;
}

Assistant:

inline V Get(Char kc) const
        {
            if (CTU(kc) < GetDirectMapSize())
            {
                if (!IsInDirectMap(CTU(kc)))
                {
                    return defv;
                }
                return GetDirectMap(CTU(kc));
            }
            else
            {
                V lastOcc;
                if (!GetNonDirect(CTU(kc), lastOcc))
                {
                    return defv;
                }
                return lastOcc;
            }
        }